

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

bool google::protobuf::compiler::objectivec::ParseSimpleStream
               (ZeroCopyInputStream *input_stream,string *stream_name,LineConsumer *line_consumer,
               string *out_error)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  StringPiece chunk;
  int buf_len;
  void *buf;
  string local_error;
  Parser parser;
  int local_bc;
  string *local_b8;
  string *local_b0;
  char *local_a8;
  string local_a0;
  StringPiece local_80;
  undefined1 local_60 [16];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_60._8_4_ = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_b8 = out_error;
  local_b0 = stream_name;
  local_60._0_8_ = line_consumer;
  do {
    do {
      iVar3 = (*input_stream->_vptr_ZeroCopyInputStream[2])(input_stream,&local_a8,&local_bc);
      pcVar1 = local_a8;
      if ((char)iVar3 == '\0') {
        if (local_48 == 0) {
LAB_002b0cbc:
          bVar2 = true;
          goto LAB_002b0cbe;
        }
        stringpiece_internal::StringPiece::StringPiece(&local_80,"\n");
        bVar2 = anon_unknown_0::Parser::ParseChunk((Parser *)local_60,local_80,&local_a0);
        if (bVar2) {
          if (local_48 == 0) goto LAB_002b0cbc;
          std::__cxx11::string::assign((char *)&local_a0);
        }
        anon_unknown_0::FullErrorString((string *)&local_80,local_b0,local_60._8_4_,&local_a0);
        goto LAB_002b0c9e;
      }
    } while ((long)local_bc == 0);
    sVar4 = stringpiece_internal::StringPiece::CheckSize((long)local_bc);
    chunk.length_ = sVar4;
    chunk.ptr_ = pcVar1;
    bVar2 = anon_unknown_0::Parser::ParseChunk((Parser *)local_60,chunk,&local_a0);
  } while (bVar2);
  anon_unknown_0::FullErrorString((string *)&local_80,local_b0,local_60._8_4_,&local_a0);
LAB_002b0c9e:
  std::__cxx11::string::operator=((string *)local_b8,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  bVar2 = false;
LAB_002b0cbe:
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_a0);
  return bVar2;
}

Assistant:

bool ParseSimpleStream(io::ZeroCopyInputStream& input_stream,
                       const std::string& stream_name,
                       LineConsumer* line_consumer,
                       std::string* out_error) {
  std::string local_error;
  Parser parser(line_consumer);
  const void* buf;
  int buf_len;
  while (input_stream.Next(&buf, &buf_len)) {
    if (buf_len == 0) {
      continue;
    }

    if (!parser.ParseChunk(StringPiece(static_cast<const char*>(buf), buf_len),
                           &local_error)) {
      *out_error = FullErrorString(stream_name, parser.last_line(), local_error);
      return false;
    }
  }
  if (!parser.Finish(&local_error)) {
    *out_error = FullErrorString(stream_name, parser.last_line(), local_error);
    return false;
  }
  return true;
}